

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_dumb.cpp
# Opt level: O1

DUMBFILE *
dumb_read_allfile(dumbfile_mem_status *filestate,BYTE *start,FileReader *reader,int lenhave,
                 int lenfull)

{
  int iVar1;
  BYTE *__dest;
  undefined4 extraout_var;
  DUMBFILE *pDVar2;
  int iVar3;
  
  filestate->size = lenfull;
  filestate->offset = 0;
  iVar3 = lenfull - lenhave;
  if (iVar3 == 0 || lenfull < lenhave) {
    filestate->ptr = start;
  }
  else {
    __dest = (BYTE *)operator_new__((long)lenfull);
    memcpy(__dest,start,(long)lenhave);
    iVar1 = (*(reader->super_FileReaderBase)._vptr_FileReaderBase[2])
                      (reader,__dest + lenhave,(long)iVar3);
    if (CONCAT44(extraout_var,iVar1) != (long)iVar3) {
      operator_delete__(__dest);
      return (DUMBFILE *)0x0;
    }
    filestate->ptr = __dest;
  }
  pDVar2 = dumbfile_open_ex(filestate,&mem_dfs);
  return pDVar2;
}

Assistant:

DUMBFILE *dumb_read_allfile(dumbfile_mem_status *filestate, BYTE *start, FileReader &reader, int lenhave, int lenfull)
{
	filestate->size = lenfull;
	filestate->offset = 0;
	if (lenhave >= lenfull)
		filestate->ptr = (BYTE *)start;
    else
    {
        BYTE *mem = new BYTE[lenfull];
        memcpy(mem, start, lenhave);
        if (reader.Read(mem + lenhave, lenfull - lenhave) != (lenfull - lenhave))
        {
            delete[] mem;
            return NULL;
        }
        filestate->ptr = mem;
    }
    return dumbfile_open_ex(filestate, &mem_dfs);
}